

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimizedInterleavePatterns.cpp
# Opt level: O3

bool anon_unknown.dwarf_298c07::compare
               (FrameBuffer *asRead,FrameBuffer *asWritten,Box2i *dataWindow,bool nonfatal)

{
  int iVar1;
  _Rb_tree_color _Var2;
  bool bVar3;
  char cVar4;
  uint uVar5;
  float fVar6;
  uint uVar7;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree_node_base *p_Var9;
  long lVar10;
  uint *puVar11;
  long lVar12;
  float *pfVar13;
  ulong uVar14;
  ostream *poVar15;
  int iVar16;
  half hVar17;
  long lVar18;
  long lVar19;
  half hVar20;
  float fVar21;
  char local_51;
  Box2i *local_50;
  FrameBuffer *local_48;
  _Rb_tree_node_base *local_40;
  FrameBuffer *local_38;
  
  local_50 = dataWindow;
  local_48 = asWritten;
  p_Var8 = (_Rb_tree_node_base *)Imf_3_4::FrameBuffer::begin();
  local_38 = asRead;
  do {
    p_Var9 = (_Rb_tree_node_base *)Imf_3_4::FrameBuffer::end();
    if (p_Var8 == p_Var9) {
      return SUB81(p_Var9,0);
    }
    local_40 = p_Var8 + 1;
    lVar10 = Imf_3_4::FrameBuffer::find((char *)local_48);
    iVar1 = (local_50->min).y;
    iVar16 = (local_50->max).y;
    if (iVar1 <= iVar16) {
      uVar14 = (ulong)(uint)(local_50->max).x;
      lVar19 = (long)iVar1;
      do {
        iVar1 = (local_50->min).x;
        lVar18 = (long)iVar1;
        if (iVar1 <= (int)uVar14) {
          do {
            _Var2 = p_Var8[9]._M_color;
            if (_Var2 != _S_red) {
              puVar11 = (uint *)((long)&(p_Var8[9]._M_parent)->_M_color +
                                (long)p_Var8[9]._M_left * lVar18 + (long)p_Var8[9]._M_right * lVar19
                                );
              if (_Var2 == _S_black) {
                hVar20._h = (uint16_t)*puVar11;
              }
              else {
                if (_Var2 != 2) goto LAB_0018d8a3;
                if ((-(int)puVar11 & 3U) != 0) {
                  __assert_fail("alignToFour (ptr) == ptr",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testOptimizedInterleavePatterns.cpp"
                                ,0xe0,
                                "bool (anonymous namespace)::compare(const FrameBuffer &, const FrameBuffer &, const Box2i &, bool)"
                               );
                }
                uVar7 = *puVar11;
                uVar5 = uVar7 & 0x7fffffff;
                hVar20._h = (ushort)(uVar7 >> 0x10) & 0x8000;
                if (uVar5 < 0x38800000) {
                  if ((0x33000000 < uVar5) &&
                     (uVar7 = uVar7 & 0x7fffff | 0x800000, cVar4 = (char)(uVar5 >> 0x17),
                     hVar20._h = hVar20._h | (ushort)(uVar7 >> (0x7eU - cVar4 & 0x1f)),
                     0x80000000 < uVar7 << (cVar4 + 0xa2U & 0x1f))) {
                    hVar20._h = hVar20._h + 1;
                  }
                }
                else if (uVar5 < 0x7f800000) {
                  if (uVar5 < 0x477ff000) {
                    hVar20._h = (ushort)(uVar5 + 0x8000fff + (uint)((uVar5 >> 0xd & 1) != 0) >> 0xd)
                                | hVar20._h;
                  }
                  else {
                    hVar20._h = hVar20._h | 0x7c00;
                  }
                }
                else {
                  hVar20._h = hVar20._h | 0x7c00;
                  if (uVar5 != 0x7f800000) {
                    uVar7 = uVar5 >> 0xd & 0x3ff;
                    hVar20._h = hVar20._h | (ushort)uVar7 | (ushort)(uVar7 == 0);
                  }
                }
              }
              lVar12 = Imf_3_4::FrameBuffer::end();
              if (lVar10 == lVar12) {
                fVar21 = (float)(double)p_Var8[10]._M_parent;
LAB_0018d638:
                fVar6 = ABS(fVar21);
                hVar17._h = (ushort)((uint)fVar21 >> 0x10) & 0x8000;
                if ((uint)fVar6 < 0x38800000) {
                  if ((0x33000000 < (uint)fVar6) &&
                     (uVar7 = (uint)fVar21 & 0x7fffff | 0x800000,
                     cVar4 = (char)((uint)fVar6 >> 0x17),
                     hVar17._h = hVar17._h | (ushort)(uVar7 >> (0x7eU - cVar4 & 0x1f)),
                     0x80000000 < uVar7 << (cVar4 + 0xa2U & 0x1f))) {
                    hVar17._h = hVar17._h + 1;
                  }
                }
                else if ((uint)fVar6 < 0x7f800000) {
                  if ((uint)fVar6 < 0x477ff000) {
                    hVar17._h = (ushort)((int)fVar6 + 0x8000fffU +
                                         (uint)(((uint)fVar6 >> 0xd & 1) != 0) >> 0xd) | hVar17._h;
                  }
                  else {
                    hVar17._h = hVar17._h | 0x7c00;
                  }
                }
                else {
                  hVar17._h = hVar17._h | 0x7c00;
                  if (fVar6 != INFINITY) {
                    uVar7 = (uint)fVar6 >> 0xd & 0x3ff;
                    hVar17._h = hVar17._h | (ushort)uVar7 | (ushort)(uVar7 == 0);
                  }
                }
              }
              else {
                iVar1 = *(int *)(lVar10 + 0x120);
                if (iVar1 == 0) goto LAB_0018d718;
                pfVar13 = (float *)(*(long *)(lVar10 + 0x130) * lVar18 +
                                   *(long *)(lVar10 + 0x138) * lVar19 + *(long *)(lVar10 + 0x128));
                if (iVar1 != 1) {
                  if (iVar1 != 2) {
LAB_0018d8a3:
                    std::operator<<((ostream *)&std::cout,"don\'t know about that\n");
                    exit(1);
                  }
                  if ((-(int)pfVar13 & 3U) != 0) {
                    __assert_fail("alignToFour (ptr) == ptr",
                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testOptimizedInterleavePatterns.cpp"
                                  ,0xf5,
                                  "bool (anonymous namespace)::compare(const FrameBuffer &, const FrameBuffer &, const Box2i &, bool)"
                                 );
                  }
                  fVar21 = *pfVar13;
                  goto LAB_0018d638;
                }
                hVar17._h = *(uint16_t *)pfVar13;
              }
              if (hVar17._h != hVar20._h) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"\n\nerror reading back channel ",0x1d);
                poVar15 = std::operator<<((ostream *)&std::cout,(char *)local_40);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15," pixel ",7);
                poVar15 = (ostream *)std::ostream::operator<<(poVar15,(int)lVar18);
                local_51 = ',';
                poVar15 = std::__ostream_insert<char,std::char_traits<char>>(poVar15,&local_51,1);
                poVar15 = (ostream *)std::ostream::operator<<(poVar15,(int)lVar19);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15," got ",5);
                poVar15 = (ostream *)::operator<<(poVar15,hVar20);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15," expected ",10);
                poVar15 = (ostream *)::operator<<(poVar15,hVar17);
                std::endl<char,std::char_traits<char>>(poVar15);
                __assert_fail("writtenHalf.bits () == readHalf.bits ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testOptimizedInterleavePatterns.cpp"
                              ,0x109,
                              "bool (anonymous namespace)::compare(const FrameBuffer &, const FrameBuffer &, const Box2i &, bool)"
                             );
              }
            }
LAB_0018d718:
            uVar14 = (ulong)(local_50->max).x;
            bVar3 = lVar18 < (long)uVar14;
            lVar18 = lVar18 + 1;
          } while (bVar3);
          iVar16 = (local_50->max).y;
        }
        bVar3 = lVar19 < iVar16;
        lVar19 = lVar19 + 1;
      } while (bVar3);
    }
    p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
  } while( true );
}

Assistant:

bool
compare (
    const FrameBuffer& asRead,
    const FrameBuffer& asWritten,
    const Box2i&       dataWindow,
    bool               nonfatal)
{
    for (FrameBuffer::ConstIterator i = asRead.begin (); i != asRead.end ();
         i++)
    {
        FrameBuffer::ConstIterator p = asWritten.find (i.name ());
        for (int y = dataWindow.min.y; y <= dataWindow.max.y; y++)
        {
            for (int x = dataWindow.min.x; x <= dataWindow.max.x; x++)

            {
                //
                // extract value read back from file
                //
                intptr_t base = reinterpret_cast<intptr_t> (i.slice ().base);
                char*    ptr  = reinterpret_cast<char*> (
                    base + i.slice ().yStride * intptr_t (y) +
                    i.slice ().xStride * intptr_t (x));
                half readHalf;
                switch (i.slice ().type)
                {
                    case IMF::FLOAT:
                        assert (alignToFour (ptr) == ptr);
                        readHalf = half (*(float*) ptr);
                        break;
                    case IMF::HALF: readHalf = half (*(half*) ptr); break;
                    case IMF::UINT: continue; // can't very well check this
                    default: cout << "don't know about that\n"; exit (1);
                }

                half writtenHalf;

                if (p != asWritten.end ())
                {

                    intptr_t base =
                        reinterpret_cast<intptr_t> (p.slice ().base);
                    char* ptr = reinterpret_cast<char*> (
                        base + p.slice ().yStride * intptr_t (y) +
                        p.slice ().xStride * intptr_t (x));
                    switch (p.slice ().type)
                    {
                        case IMF::FLOAT:
                            assert (alignToFour (ptr) == ptr);
                            writtenHalf = half (*(float*) ptr);
                            break;
                        case IMF::HALF:
                            writtenHalf = half (*(half*) ptr);
                            break;
                        case IMF::UINT: continue;
                        default: cout << "don't know about that\n"; exit (1);
                    }
                }
                else { writtenHalf = half (i.slice ().fillValue); }

                if (writtenHalf.bits () != readHalf.bits ())
                {
                    if (nonfatal) { return false; }
                    else
                    {
                        cout << "\n\nerror reading back channel " << i.name ()
                             << " pixel " << x << ',' << y << " got "
                             << readHalf << " expected " << writtenHalf << endl;
                        assert (writtenHalf.bits () == readHalf.bits ());
                        exit (1);
                    }
                }
            }
        }
    }
    return true;
}